

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.hpp
# Opt level: O3

void __thiscall
Diligent::FunctionStubHashKey::FunctionStubHashKey
          (FunctionStubHashKey *this,Char *_Obj,Char *_Func,Uint32 _NumArgs)

{
  HashMapStringKey::HashMapStringKey(&this->Object,_Obj,false);
  HashMapStringKey::HashMapStringKey(&this->Function,_Func,false);
  this->NumArguments = _NumArgs;
  return;
}

Assistant:

FunctionStubHashKey(const Char* _Obj, const Char* _Func, Uint32 _NumArgs) :
        Object      {_Obj    },
        Function    {_Func   },
        NumArguments{_NumArgs}
    {
    }